

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
cmListCommand::HandleTransformCommand::ActionDescriptor::~ActionDescriptor(ActionDescriptor *this)

{
  ActionDescriptor *this_local;
  
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->Transform);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }